

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O2

void __thiscall
webrtc::SparseFIRFilter::Filter(SparseFIRFilter *this,float *in,size_t length,float *out)

{
  size_t sVar1;
  pointer pfVar2;
  pointer pfVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  float *pfVar6;
  ulong uVar7;
  pointer pfVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  float fVar14;
  
  sVar1 = this->sparsity_;
  uVar4 = this->offset_;
  pfVar8 = (this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar8 >> 2;
  pfVar6 = in + -uVar4;
  lVar10 = (uVar9 - 1) * sVar1 * 4;
  for (uVar11 = 0; uVar11 != length; uVar11 = uVar11 + 1) {
    out[uVar11] = 0.0;
    pfVar2 = (this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar14 = 0.0;
    uVar5 = uVar4;
    pfVar13 = pfVar6;
    lVar12 = lVar10;
    for (uVar7 = 0; (uVar5 <= uVar11 && (uVar7 < (ulong)((long)pfVar3 - (long)pfVar2 >> 2)));
        uVar7 = uVar7 + 1) {
      fVar14 = fVar14 + *pfVar13 * pfVar2[uVar7];
      out[uVar11] = fVar14;
      pfVar13 = pfVar13 + -sVar1;
      uVar5 = uVar5 + sVar1;
      lVar12 = lVar12 + sVar1 * -4;
    }
    uVar5 = uVar7;
    if (uVar7 < uVar9) {
      uVar5 = uVar9;
    }
    pfVar13 = (float *)(lVar12 + (long)(this->state_).
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_start);
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      fVar14 = fVar14 + *pfVar13 * pfVar8[uVar7];
      out[uVar11] = fVar14;
      pfVar13 = pfVar13 + -sVar1;
    }
    pfVar6 = pfVar6 + 1;
    lVar10 = lVar10 + 4;
  }
  pfVar8 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)pfVar2 - (long)pfVar8;
  if (__n != 0) {
    uVar4 = (long)pfVar2 - (long)pfVar8 >> 2;
    if (uVar4 < length || uVar4 - length == 0) {
      in = in + (length - uVar4);
    }
    else {
      memmove(pfVar8,pfVar8 + length,(uVar4 - length) * 4);
      pfVar8 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar8 = pfVar8 + (((ulong)((long)(this->state_).
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pfVar8) >> 2) -
                        length);
      __n = length << 2;
    }
    memcpy(pfVar8,in,__n);
    return;
  }
  return;
}

Assistant:

void SparseFIRFilter::Filter(const float* in, size_t length, float* out) {
  // Convolves the input signal |in| with the filter kernel |nonzero_coeffs_|
  // taking into account the previous state.
  for (size_t i = 0; i < length; ++i) {
    out[i] = 0.f;
    size_t j;
    for (j = 0; i >= j * sparsity_ + offset_ &&
                j < nonzero_coeffs_.size(); ++j) {
      out[i] += in[i - j * sparsity_ - offset_] * nonzero_coeffs_[j];
    }
    for (; j < nonzero_coeffs_.size(); ++j) {
      out[i] += state_[i + (nonzero_coeffs_.size() - j - 1) * sparsity_] *
                nonzero_coeffs_[j];
    }
  }

  // Update current state.
  if (state_.size() > 0u) {
    if (length >= state_.size()) {
      std::memcpy(&state_[0],
                  &in[length - state_.size()],
                  state_.size() * sizeof(*in));
    } else {
      std::memmove(&state_[0],
                   &state_[length],
                   (state_.size() - length) * sizeof(state_[0]));
      std::memcpy(&state_[state_.size() - length], in, length * sizeof(*in));
    }
  }
}